

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.cpp
# Opt level: O2

Sexp * Builtin_Sub(Sexp *fst,Sexp *snd)

{
  Sexp *pSVar1;
  JetRuntimeException *pJVar2;
  string local_78;
  string local_58;
  Sexp *local_38;
  Sexp *fst_local;
  Sexp *snd_local;
  FrameProtector __frame_prot;
  
  local_38 = fst;
  fst_local = snd;
  FrameProtector::FrameProtector((FrameProtector *)&snd_local,"Builtin_Sub");
  FrameProtector::ProtectValue((FrameProtector *)&snd_local,&local_38,"fst");
  FrameProtector::ProtectValue((FrameProtector *)&snd_local,&fst_local,"snd");
  if (local_38->kind != FIXNUM) {
    pJVar2 = (JetRuntimeException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_78,"type error: not a fixnum",
               (allocator *)((long)&__frame_prot.protected_frame + 7));
    JetRuntimeException::JetRuntimeException(pJVar2,&local_78);
    __cxa_throw(pJVar2,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
  }
  if (fst_local->kind == FIXNUM) {
    pSVar1 = GcHeap::AllocateFixnum
                       ((local_38->field_1).fixnum_value - (fst_local->field_1).fixnum_value);
    FrameProtector::~FrameProtector((FrameProtector *)&snd_local);
    return pSVar1;
  }
  pJVar2 = (JetRuntimeException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_58,"type error: not a fixnum",
             (allocator *)((long)&__frame_prot.protected_frame + 7));
  JetRuntimeException::JetRuntimeException(pJVar2,&local_58);
  __cxa_throw(pJVar2,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
}

Assistant:

Sexp *Builtin_Sub(Sexp *fst, Sexp *snd) {
  GC_HELPER_FRAME;
  GC_PROTECT(fst);
  GC_PROTECT(snd);

  if (!fst->IsFixnum()) {
    throw JetRuntimeException("type error: not a fixnum");
  }

  if (!snd->IsFixnum()) {
    throw JetRuntimeException("type error: not a fixnum");
  }

  return GcHeap::AllocateFixnum(fst->fixnum_value - snd->fixnum_value);
}